

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

bool __thiscall luna::State::CallFunction(State *this,Value *f,int arg_count,int expect_result)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  bool bVar1;
  State *in_stack_00000030;
  int in_stack_00000044;
  Value *in_stack_00000048;
  State *in_stack_00000050;
  bool local_1;
  
  bVar1 = true;
  if (*(int *)(in_RSI + 8) != 5) {
    bVar1 = *(int *)(in_RSI + 8) == 9;
  }
  if (!bVar1) {
    __assert_fail("f->type_ == ValueT_Closure || f->type_ == ValueT_CFunction",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/State.cpp"
                  ,0x61,"bool luna::State::CallFunction(Value *, int, int)");
  }
  if (in_EDX != -1) {
    *(long *)(in_RDI + 0x40) = in_RSI + 0x10 + (long)in_EDX * 0x10;
  }
  local_1 = *(int *)(in_RSI + 8) != 5;
  if (local_1) {
    CallCFunction(in_stack_00000030,(Value *)this,f._4_4_);
  }
  else {
    CallClosure(in_stack_00000050,in_stack_00000048,in_stack_00000044);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool State::CallFunction(Value *f, int arg_count, int expect_result)
    {
        assert(f->type_ == ValueT_Closure || f->type_ == ValueT_CFunction);

        // Set stack top when arg_count is fixed
        if (arg_count != EXP_VALUE_COUNT_ANY)
            stack_.top_ = f + 1 + arg_count;

        if (f->type_ == ValueT_Closure)
        {
            // We need enter next ExecuteFrame
            CallClosure(f, expect_result);
            return true;
        }
        else
        {
            CallCFunction(f, expect_result);
            return false;
        }
    }